

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

path * __thiscall ArgsManager::GetDataDir(ArgsManager *this,bool net_specific)

{
  bool bVar1;
  ArgsManager *this_00;
  string *psVar2;
  byte in_DL;
  long in_RSI;
  path *in_RDI;
  long in_FS_OFFSET;
  path *path;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  path datadir;
  CBaseChainParams *in_stack_fffffffffffffe58;
  path *in_stack_fffffffffffffe60;
  path *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  allocator<char> *in_stack_fffffffffffffe98;
  path *default_value;
  string local_101 [3];
  string local_a0;
  path local_78 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
  if ((in_DL & 1) == 0) {
    this_00 = (ArgsManager *)(in_RSI + 0x1f8);
  }
  else {
    this_00 = (ArgsManager *)(in_RSI + 0x220);
  }
  bVar1 = std::filesystem::__cxx11::path::empty((path *)in_stack_fffffffffffffe58);
  if (!bVar1) {
    fs::path::path((path *)in_stack_fffffffffffffe58,(path *)0x18fe809);
    goto LAB_018feb04;
  }
  psVar2 = local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)psVar2,in_stack_fffffffffffffe98);
  local_78[0].super_path._M_pathname.field_2._M_allocated_capacity = 0;
  local_78[0].super_path._M_pathname.field_2._8_8_ = 0;
  local_78[0].super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_78[0].super_path._M_pathname._M_string_length = 0;
  local_78[0].super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  default_value = local_78;
  fs::path::path((path *)in_stack_fffffffffffffe58);
  GetPathArg(this_00,psVar2,default_value);
  fs::path::~path((path *)in_stack_fffffffffffffe58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe58);
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  bVar1 = std::filesystem::__cxx11::path::empty((path *)in_stack_fffffffffffffe58);
  if (bVar1) {
    GetDefaultDataDir();
    fs::path::operator=((path *)in_stack_fffffffffffffe68,(path *)in_stack_fffffffffffffe60);
    fs::path::~path((path *)in_stack_fffffffffffffe58);
LAB_018fea19:
    if ((in_DL & 1) != 0) {
      BaseParams();
      CBaseChainParams::DataDir_abi_cxx11_(in_stack_fffffffffffffe58);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe58);
      if (!bVar1) {
        BaseParams();
        psVar2 = CBaseChainParams::DataDir_abi_cxx11_(in_stack_fffffffffffffe58);
        fs::PathFromString(in_stack_fffffffffffffe88);
        fs::path::operator/=((path *)psVar2,in_stack_fffffffffffffe60);
        fs::path::~path((path *)in_stack_fffffffffffffe58);
      }
    }
    fs::path::path((path *)in_stack_fffffffffffffe58,(path *)0x18feadc);
  }
  else {
    fs::absolute((path *)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe88 = &local_a0;
    fs::path::operator=((path *)in_stack_fffffffffffffe68,(path *)in_stack_fffffffffffffe60);
    fs::path::~path((path *)in_stack_fffffffffffffe58);
    bVar1 = std::filesystem::is_directory(in_stack_fffffffffffffe68);
    if (bVar1) goto LAB_018fea19;
    fs::path::operator=((path *)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe68);
    fs::path::path((path *)in_stack_fffffffffffffe58,(path *)0x18fe96e);
  }
  fs::path::~path((path *)in_stack_fffffffffffffe58);
LAB_018feb04:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

fs::path ArgsManager::GetDataDir(bool net_specific) const
{
    LOCK(cs_args);
    fs::path& path = net_specific ? m_cached_network_datadir_path : m_cached_datadir_path;

    // Used cached path if available
    if (!path.empty()) return path;

    const fs::path datadir{GetPathArg("-datadir")};
    if (!datadir.empty()) {
        path = fs::absolute(datadir);
        if (!fs::is_directory(path)) {
            path = "";
            return path;
        }
    } else {
        path = GetDefaultDataDir();
    }

    if (net_specific && !BaseParams().DataDir().empty()) {
        path /= fs::PathFromString(BaseParams().DataDir());
    }

    return path;
}